

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

uint64_t __thiscall Imf_3_4::Header::writeTo(Header *this,OStream *os,bool isTiled)

{
  int iVar1;
  TypedAttribute<Imf_3_4::PreviewImage> *pTVar2;
  char *v;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  string s;
  StdOSStream oss;
  uint local_1f4;
  string local_1f0;
  StdOSStream local_1d0;
  uint64_t uVar3;
  
  pTVar2 = findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>>(this,"preview");
  p_Var4 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 == p_Var5) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(char *)(p_Var4 + 1));
      v = (char *)(**(code **)(**(long **)(p_Var4 + 9) + 0x10))();
      Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,v);
      StdOSStream::StdOSStream(&local_1d0);
      (**(code **)(**(long **)(p_Var4 + 9) + 0x20))(*(long **)(p_Var4 + 9),&local_1d0,2);
      StdOSStream::str_abi_cxx11_(&local_1f0,&local_1d0);
      local_1f4 = (uint)local_1f0._M_string_length;
      (*os->_vptr_OStream[2])(os,&local_1f4,4);
      if (*(TypedAttribute<Imf_3_4::PreviewImage> **)(p_Var4 + 9) == pTVar2) {
        iVar1 = (*os->_vptr_OStream[3])(os);
        uVar3 = CONCAT44(extraout_var,iVar1);
      }
      (*os->_vptr_OStream[2])(os,local_1f0._M_dataplus._M_p,(ulong)(uint)local_1f0._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      StdOSStream::~StdOSStream(&local_1d0);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,"");
  return uVar3;
}

Assistant:

uint64_t
Header::writeTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, bool isTiled) const
{
    //
    // Write a "magic number" to identify the file as an image file.
    // Write the current file format version number.
    //

    int version = EXR_VERSION;

    //
    // Write all attributes.  If we have a preview image attribute,
    // keep track of its position in the file.
    //

    uint64_t previewPosition = 0;

    const Attribute* preview =
        findTypedAttribute<PreviewImageAttribute> ("preview");

    for (ConstIterator i = begin (); i != end (); ++i)
    {
        //
        // Write the attribute's name and type.
        //

        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, i.name ());
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            os, i.attribute ().typeName ());

        //
        // Write the size of the attribute value,
        // and the value itself.
        //

        StdOSStream oss;
        i.attribute ().writeValueTo (oss, version);

        std::string s = oss.str ();
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, (int) s.length ());

        if (&i.attribute () == preview) previewPosition = os.tellp ();

        os.write (s.data (), int (s.length ()));
    }

    //
    // Write zero-length attribute name to mark the end of the header.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, "");

    return previewPosition;
}